

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<double,true>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  double value;
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  code *pcVar3;
  bool bVar4;
  DynamicObjectFlags DVar5;
  undefined4 *puVar6;
  Var pvVar7;
  ulong uVar8;
  double local_38;
  
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar5 & HasNoMissingValues) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar4) goto LAB_00b87e1a;
    *puVar6 = 0;
  }
  pSVar2 = (this->super_JavascriptArray).head.ptr;
  uVar1 = pSVar2->length;
  if (uVar1 != (this->super_JavascriptArray).super_ArrayObject.length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar4) goto LAB_00b87e1a;
    *puVar6 = 0;
  }
  if ((pSVar2->next).ptr == (SparseArraySegmentBase *)0x0) {
    local_38 = *(double *)(pSVar2 + 1);
    if ((ulong)uVar1 != 0) {
      uVar8 = 0;
      do {
        value = *(double *)(&pSVar2[1].left + uVar8 * 2);
        bVar4 = NumberUtilities::IsNan(value);
        if (bVar4) {
          return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        }
        if (findMax) {
          if (local_38 < value) {
LAB_00b87d7e:
            local_38 = value;
          }
        }
        else if ((value < local_38) ||
                (((value == 0.0 && (!NAN(value))) &&
                 (bVar4 = NumberUtilities::IsSpecial(local_38,0x8000000000000000), bVar4))))
        goto LAB_00b87d7e;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    pvVar7 = JavascriptNumber::ToVarNoCheck(local_38,scriptContext);
    return pvVar7;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0xa2b,"(false)",
                              "FindMinOrMax currently supports native arrays with only one segment")
  ;
  if (bVar4) {
    *puVar6 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00b87e1a:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }